

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O1

void LDSketch_write_plaintext(LDSketch_t *sk,char *outfile)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  uchar *keys;
  longlong lVar7;
  long in_RCX;
  void *__s2;
  size_t nmemb;
  int iVar8;
  int iVar9;
  char *thresh;
  int *in_R8;
  int iVar10;
  long lVar11;
  int iVar12;
  uint64_t key_int;
  long *aplStack_88 [2];
  long alStack_78 [2];
  LDSketch_t *pLStack_68;
  uchar local_38 [8];
  
  thresh = "w";
  __stream = fopen(outfile,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"Worker: %u, length of key: %d\n",(ulong)sk->tbl_id,(ulong)(uint)sk->lgn);
    fprintf(__stream,"# of hash row: %d\n",(ulong)(uint)sk->h);
    fprintf(__stream,"# of buckets: %d\n",(ulong)(uint)sk->w);
    builtin_memcpy(local_38,"\b\a\x06\x05\x04\x03\x02\x01",8);
    if (0 < sk->h) {
      iVar8 = 0;
      do {
        uVar2 = LDSketch_find(sk,local_38,0,sk->lgn + -1,iVar8);
        fprintf(__stream,"%u ",(ulong)uVar2);
        iVar8 = iVar8 + 1;
      } while (iVar8 < sk->h);
    }
    fputc(10,__stream);
    if (0 < sk->h) {
      iVar8 = 0;
      do {
        iVar9 = sk->w;
        if (0 < iVar9) {
          iVar10 = 0;
          do {
            lVar7 = sk->tbl[(uint)(iVar9 * iVar8 + iVar10)]->total;
            uVar2 = dyn_tbl_length(sk->tbl[(uint)(iVar9 * iVar8 + iVar10)]);
            fprintf(__stream,"%lld %d, ",lVar7,(ulong)uVar2);
            iVar10 = iVar10 + 1;
            iVar9 = sk->w;
          } while (iVar10 < iVar9);
        }
        fputc(10,__stream);
        iVar8 = iVar8 + 1;
      } while (iVar8 < sk->h);
    }
    fclose(__stream);
    return;
  }
  LDSketch_write_plaintext();
  nmemb = 0;
  pLStack_68 = sk;
  if (0 < ((LDSketch_t *)outfile)->h * ((LDSketch_t *)outfile)->w) {
    lVar11 = 0;
    do {
      if (((long)thresh <= ((LDSketch_t *)outfile)->tbl[lVar11]->max_value) &&
         (uVar2 = dyn_tbl_length(((LDSketch_t *)outfile)->tbl[lVar11]), (int)nmemb < (int)uVar2)) {
        nmemb = (size_t)uVar2;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)((LDSketch_t *)outfile)->h * (long)((LDSketch_t *)outfile)->w);
  }
  iVar8 = ((LDSketch_t *)outfile)->lgn;
  aplStack_88[0] = alStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_88,"tmp heavy keys","");
  iVar9 = iVar8 + 7;
  if (-1 < iVar8) {
    iVar9 = iVar8;
  }
  keys = (uchar *)safe_calloc(nmemb,(long)(iVar9 >> 3),(char *)aplStack_88[0]);
  if (aplStack_88[0] != alStack_78) {
    operator_delete(aplStack_88[0],alStack_78[0] + 1);
  }
  if (((LDSketch_t *)outfile)->h * ((LDSketch_t *)outfile)->w < 1) {
    iVar8 = 0;
  }
  else {
    lVar11 = 0;
    iVar8 = 0;
    do {
      if ((long)thresh <= ((LDSketch_t *)outfile)->tbl[lVar11]->max_value) {
        dyn_tbl_get_heavy_key
                  (((LDSketch_t *)outfile)->tbl[lVar11],(longlong)thresh,keys,(int *)aplStack_88);
        if (0 < (int)aplStack_88[0]) {
          iVar9 = 0;
          do {
            bVar1 = 0 < iVar8;
            if (iVar8 < 1) {
LAB_00104ee4:
              iVar6 = ((LDSketch_t *)outfile)->lgn * iVar9;
              iVar10 = iVar6 + 7;
              if (-1 < iVar6) {
                iVar10 = iVar6;
              }
              lVar7 = LDSketch_up_estimate((LDSketch_t *)outfile,keys + (iVar10 >> 3));
              if ((long)thresh <= lVar7) {
                iVar10 = ((LDSketch_t *)outfile)->lgn;
                iVar3 = iVar10 * iVar8;
                iVar6 = iVar3 + 7;
                if (-1 < iVar3) {
                  iVar6 = iVar3;
                }
                iVar4 = iVar10 * iVar9;
                iVar3 = iVar4 + 7;
                if (-1 < iVar4) {
                  iVar3 = iVar4;
                }
                iVar4 = iVar10 + 7;
                if (-1 < iVar10) {
                  iVar4 = iVar10;
                }
                memcpy((void *)((long)(iVar6 >> 3) + (long)__s2),keys + (iVar3 >> 3),
                       (long)(iVar4 >> 3));
                *(longlong *)(in_RCX + (long)iVar8 * 8) = lVar7;
                iVar8 = iVar8 + 1;
              }
            }
            else {
              iVar10 = ((LDSketch_t *)outfile)->lgn;
              iVar3 = iVar10 * iVar9;
              iVar6 = iVar3 + 7;
              if (-1 < iVar3) {
                iVar6 = iVar3;
              }
              iVar3 = iVar10 + 7;
              if (-1 < iVar10) {
                iVar3 = iVar10;
              }
              iVar4 = bcmp(keys + (iVar6 >> 3),__s2,(long)(iVar3 >> 3));
              if (iVar4 != 0) {
                iVar12 = 0;
                iVar4 = iVar10;
                do {
                  if (iVar8 + iVar12 == 1) {
                    bVar1 = false;
                    goto LAB_00104ee4;
                  }
                  iVar5 = iVar4 + 7;
                  if (-1 < iVar4) {
                    iVar5 = iVar4;
                  }
                  iVar5 = bcmp(keys + (iVar6 >> 3),(void *)((long)(iVar5 >> 3) + (long)__s2),
                               (long)(iVar3 >> 3));
                  iVar12 = iVar12 + -1;
                  iVar4 = iVar4 + iVar10;
                } while (iVar5 != 0);
                bVar1 = -iVar12 < iVar8;
              }
            }
            if (bVar1) break;
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)aplStack_88[0]);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)((LDSketch_t *)outfile)->h * (long)((LDSketch_t *)outfile)->w);
  }
  *in_R8 = iVar8;
  return;
}

Assistant:

void LDSketch_write_plaintext(LDSketch_t* sk, const char* outfile) {
	FILE* fp;
	int i, j;

	// open a file
	if ((fp = fopen(outfile, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", outfile);
		exit(-1);
	}

	// write to a file (including n and bd???)
	fprintf(fp, "Worker: %u, length of key: %d\n", sk->tbl_id, sk->lgn);
	fprintf(fp, "# of hash row: %d\n", sk->h);
	fprintf(fp, "# of buckets: %d\n", sk->w);

	uint64_t key_int = 0x0102030405060708;
	unsigned char* key = (unsigned char*)&key_int;
	for (i = 0; i < sk->h; ++i) {
		unsigned int k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		fprintf(fp, "%u ", k);
	}
	fprintf(fp, "\n");

	for (i = 0; i < sk->h; ++i) {
		for (j = 0; j < sk->w; ++j) {
			// fprintf(fp, "%lld ", tbl->T[tbl->w*i + j]);
			unsigned int index = sk->w * i + j;
			fprintf(fp, "%lld %d, ", sk->tbl[index]->total,
				dyn_tbl_length(sk->tbl[index]));
		}
		fprintf(fp, "\n");
	}

	// close the file
	fclose(fp);
}